

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointTriface::IntLoadResidual_CqL
          (ChLinkPointTriface *this,uint off_L,ChVectorDynamic<> *R,ChVectorDynamic<> *L,double c)

{
  double dVar1;
  int iVar2;
  
  iVar2 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar2 == '\0') {
    return;
  }
  if ((long)(ulong)off_L <
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    dVar1 = c * (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                [off_L];
    ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::MultiplyTandAdd
              (&(this->constraint1).tuple_a,R,dVar1);
    ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::MultiplyTandAdd
              (&(this->constraint1).tuple_b,R,dVar1);
    if ((long)(ulong)(off_L + 1) <
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      dVar1 = c * (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data[off_L + 1];
      ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::MultiplyTandAdd
                (&(this->constraint2).tuple_a,R,dVar1);
      ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::MultiplyTandAdd
                (&(this->constraint2).tuple_b,R,dVar1);
      if ((long)(ulong)(off_L + 2) <
          (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
        dVar1 = c * (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data[off_L + 2];
        ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::MultiplyTandAdd
                  (&(this->constraint3).tuple_a,R,dVar1);
        ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>::MultiplyTandAdd
                  (&(this->constraint3).tuple_b,R,dVar1);
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChLinkPointTriface::IntLoadResidual_CqL(const unsigned int off_L,    // offset in L multipliers
                                             ChVectorDynamic<>& R,        // result: the R residual, R += c*Cq'*L
                                             const ChVectorDynamic<>& L,  // the L vector
                                             const double c               // a scaling factor
) {
    if (!IsActive())
        return;

    constraint1.MultiplyTandAdd(R, L(off_L + 0) * c);
    constraint2.MultiplyTandAdd(R, L(off_L + 1) * c);
    constraint3.MultiplyTandAdd(R, L(off_L + 2) * c);
}